

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

void __thiscall f8n::debug::FileBackend::error(FileBackend *this,string *tag,string *string)

{
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"error","");
  writeTo((ostream *)&this->out,&local_48,tag,string);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void debug::FileBackend::error(const std::string& tag, const std::string& string) {
        writeTo(this->out, "error", tag, string);
    }